

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

void bov_error_log(int errorCode,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  if (0x30000 < errorCode) {
    perror("Current system error message: ");
  }
  fprintf(_stderr,"=X= Error %d: ",errorCode);
  vl[0].gp_offset = 0x10;
  vl[0].fp_offset = 0x30;
  vl[0].overflow_arg_area = &stack0x00000008;
  vl[0].reg_save_area = local_c8;
  vfprintf(_stderr,fmt,vl);
  fputc(10,_stderr);
  return;
}

Assistant:

void bov_error_log(int errorCode, const char *fmt, ...)
{
	if(errorCode>=BOV_OUT_OF_MEM_ERROR)
		perror("Current system error message: ");

	va_list vl;
	fprintf(stderr, "=X= Error %d: ", errorCode);
	va_start(vl,fmt);
	vfprintf(stderr, fmt, vl);
	va_end(vl);
	fputc('\n', stderr);
}